

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_allocation.c
# Opt level: O2

PaUtilAllocationGroupLink *
AllocateLinks(long count,PaUtilAllocationGroupLink *nextBlock,PaUtilAllocationGroupLink *nextSpare)

{
  PaUtilAllocationGroupLink *pPVar1;
  PaUtilAllocationGroupLink *pPVar2;
  long lVar3;
  
  pPVar1 = (PaUtilAllocationGroupLink *)PaUtil_AllocateMemory(count * 0x10);
  if (pPVar1 != (PaUtilAllocationGroupLink *)0x0) {
    pPVar1->buffer = pPVar1;
    pPVar1->next = nextBlock;
    pPVar2 = pPVar1 + 2;
    for (lVar3 = 1; lVar3 < count; lVar3 = lVar3 + 1) {
      pPVar2[-1].buffer = (void *)0x0;
      pPVar2[-1].next = pPVar2;
      pPVar2 = pPVar2 + 1;
    }
    pPVar1[count + -1].next = (PaUtilAllocationGroupLink *)0x0;
  }
  return pPVar1;
}

Assistant:

static struct PaUtilAllocationGroupLink *AllocateLinks( long count,
        struct PaUtilAllocationGroupLink *nextBlock,
        struct PaUtilAllocationGroupLink *nextSpare )
{
    struct PaUtilAllocationGroupLink *result;
    int i;
    
    result = (struct PaUtilAllocationGroupLink *)PaUtil_AllocateMemory(
            sizeof(struct PaUtilAllocationGroupLink) * count );
    if( result )
    {
        /* the block link */
        result[0].buffer = result;
        result[0].next = nextBlock;

        /* the spare links */
        for( i=1; i<count; ++i )
        {
            result[i].buffer = 0;
            result[i].next = &result[i+1];
        }
        result[count-1].next = nextSpare;
    }
    
    return result;
}